

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall Js::JavascriptProxy::PreventExtensions(JavascriptProxy *this)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  int iVar7;
  HostScriptContext *pHVar8;
  Var pvVar9;
  long *plVar10;
  JavascriptFunction *function;
  undefined4 *puVar11;
  JavascriptMethod p_Var12;
  RecyclableObject *ptr;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pHVar8 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar8->scriptContext;
  pvVar9 = CrossSite::MarshalVar(pSVar2,(this->handler).ptr,false);
  if (pvVar9 == (Var)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,
               L"preventExtensions");
  }
  plVar10 = (long *)CrossSite::MarshalVar(pSVar2,(this->target).ptr,false);
  function = GetMethodHelper(this,0x122,pSVar2);
  bVar4 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x4ce,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar6 = (**(code **)(*plVar10 + 0x1a8))();
    return BVar6;
  }
  bVar4 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar5) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var12);
    p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var12)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                     pvVar9,plVar10);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00d0b422;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var12);
      p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var12)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                       pvVar9,plVar10);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00d0b422;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var12);
    p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var12)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                     pvVar9,plVar10);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar5 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d0b422:
  this_00->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  if ((BVar6 != 0) && (iVar7 = (**(code **)(*plVar10 + 0x198))(), iVar7 != 0)) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"preventExtensions");
  }
  return BVar6;
}

Assistant:

BOOL JavascriptProxy::PreventExtensions()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return  FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("preventExtensions"));
        }
        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //4. Let trap be the result of GetMethod(handler, "preventExtensions").
        //5. ReturnIfAbrupt(trap).
        //6. If trap is undefined, then
        //a.Return the result of calling the[[PreventExtensions]] internal method of target.
        //7. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target.
        JavascriptFunction* preventExtensionsMethod = GetMethodHelper(PropertyIds::preventExtensions, requestContext);
        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == preventExtensionsMethod)
        {
            return targetObj->PreventExtensions();
        }

        //8. Let booleanTrapResult be ToBoolean(trapResult)
        //9. ReturnIfAbrupt(booleanTrapResult).
        //10. Let targetIsExtensible be the result of calling the[[IsExtensible]] internal method of target.
        //11. ReturnIfAbrupt(targetIsExtensible).
        //12. If booleanTrapResult is true and targetIsExtensible is true, then throw a TypeError exception.
        //13. Return booleanTrapResult.
        Var preventExtensionsResult = threadContext->ExecuteImplicitCall(preventExtensionsMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, preventExtensionsMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        BOOL trapResult = JavascriptConversion::ToBoolean(preventExtensionsResult, requestContext);
        if (trapResult)
        {
            BOOL targetIsExtensible = targetObj->IsExtensible();
            if (targetIsExtensible)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("preventExtensions"));
            }
        }
        return trapResult;
    }